

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void checkList(IntegrityCk *pCheck,int isFreeList,int iPage,int N)

{
  byte bVar1;
  byte bVar2;
  u32 uVar3;
  uint *puVar4;
  int iVar5;
  BtShared *pBVar6;
  u32 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  DbPage *pOvflPage;
  DbPage *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar8 = iPage;
  uVar12 = N;
  if (0 < N) {
    do {
      uVar11 = (ulong)uVar12;
      if (pCheck->mxErr == 0) {
        return;
      }
      if ((int)uVar8 < 1) {
        checkAppendMsg(pCheck,"%d of %d pages missing from overflow list starting at %d",uVar11,
                       (ulong)(uint)N,(ulong)(uint)iPage);
        return;
      }
      iVar5 = checkRef(pCheck,uVar8);
      if (iVar5 != 0) {
        return;
      }
      iVar5 = (*pCheck->pPager->xGet)(pCheck->pPager,uVar8,&local_48,0);
      if (iVar5 != 0) {
        checkAppendMsg(pCheck,"failed to get page %d",(ulong)uVar8);
        return;
      }
      uVar10 = uVar12 - 1;
      puVar4 = (uint *)local_48->pData;
      if (isFreeList == 0) {
        if ((uVar12 != 1) && (pCheck->pBt->autoVacuum != '\0')) {
          uVar12 = *puVar4;
          checkPtrmap(pCheck,uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                             uVar12 << 0x18,'\x04',uVar8);
        }
      }
      else {
        uVar12 = puVar4[1];
        uVar9 = (uint)*(byte *)((long)puVar4 + 5);
        bVar1 = *(byte *)((long)puVar4 + 6);
        bVar2 = *(byte *)((long)puVar4 + 7);
        pBVar6 = pCheck->pBt;
        local_38 = uVar11;
        if (pBVar6->autoVacuum != '\0') {
          local_40 = (ulong)*(byte *)((long)puVar4 + 5);
          checkPtrmap(pCheck,uVar8,'\x02',0);
          uVar9 = (uint)local_40;
          pBVar6 = pCheck->pBt;
        }
        iVar5 = (uint)(byte)uVar12 * 0x1000000;
        uVar13 = (uint)bVar1 * 0x100;
        uVar12 = uVar9 * 0x10000 + iVar5 | uVar13 | (uint)bVar2;
        uVar3 = pBVar6->usableSize;
        uVar7 = uVar3 + 3;
        if (-1 < (int)uVar3) {
          uVar7 = uVar3;
        }
        if (((int)uVar7 >> 2) + -2 < (int)uVar12) {
          checkAppendMsg(pCheck,"freelist leaf count too big on page %d",(ulong)uVar8);
          uVar10 = (int)local_38 - 2;
        }
        else {
          if (0 < (int)uVar12) {
            uVar11 = 0;
            do {
              uVar8 = puVar4[uVar11 + 2];
              uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                      uVar8 << 0x18;
              if (pCheck->pBt->autoVacuum != '\0') {
                checkPtrmap(pCheck,uVar8,'\x02',0);
              }
              checkRef(pCheck,uVar8);
              uVar11 = uVar11 + 1;
            } while (uVar13 + bVar2 + iVar5 + uVar9 * 0x10000 != uVar11);
          }
          uVar10 = uVar10 - uVar12;
        }
      }
      uVar12 = *puVar4;
      if (local_48 != (DbPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_48);
      }
      uVar8 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      if ((isFreeList != 0) && ((int)uVar10 < (int)(uint)(uVar8 != 0))) {
        checkAppendMsg(pCheck,"free-page count in header is too small");
        return;
      }
      uVar12 = uVar10;
    } while (0 < (int)uVar10);
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  int iPage,            /* Page number for first page in the list */
  int N                 /* Expected number of pages in the list */
){
  int i;
  int expected = N;
  int iFirst = iPage;
  while( N-- > 0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( iPage<1 ){
      checkAppendMsg(pCheck,
         "%d of %d pages missing from overflow list starting at %d",
          N+1, expected, iFirst);
      break;
    }
    if( checkRef(pCheck, iPage) ) break;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage, 0) ){
      checkAppendMsg(pCheck, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      int n = get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>(int)pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);

    if( isFreeList && N<(iPage!=0) ){
      checkAppendMsg(pCheck, "free-page count in header is too small");
    }
  }
}